

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<void> __thiscall
kj::Promise<void>::attach<kj::Own<kj::WebSocket>,kj::Own<kj::WebSocket>>
          (Promise<void> *this,Own<kj::WebSocket> *attachments,Own<kj::WebSocket> *attachments_1)

{
  Own<kj::_::PromiseNode> *params;
  Own<kj::WebSocket> *this_00;
  Own<kj::WebSocket> *params_00;
  Own<kj::WebSocket> *in_RCX;
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::Own<kj::WebSocket>,_kj::Own<kj::WebSocket>_>
  local_68;
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::WebSocket>,_kj::Own<kj::WebSocket>_>_>_>
  local_48;
  Own<kj::_::PromiseNode> local_38;
  Own<kj::WebSocket> *local_28;
  Own<kj::WebSocket> *attachments_local_1;
  Own<kj::WebSocket> *attachments_local;
  Promise<void> *this_local;
  
  local_28 = in_RCX;
  attachments_local_1 = attachments_1;
  attachments_local = attachments;
  this_local = this;
  params = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)attachments);
  this_00 = fwd<kj::Own<kj::WebSocket>>(attachments_local_1);
  params_00 = fwd<kj::Own<kj::WebSocket>>(local_28);
  tuple<kj::Own<kj::WebSocket>,kj::Own<kj::WebSocket>>(&local_68,(kj *)this_00,params_00,in_RCX);
  heap<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::WebSocket>,kj::Own<kj::WebSocket>>>,kj::Own<kj::_::PromiseNode>,kj::_::Tuple<kj::Own<kj::WebSocket>,kj::Own<kj::WebSocket>>>
            ((kj *)&local_48,params,&local_68);
  Own<kj::_::PromiseNode>::
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::WebSocket>,kj::Own<kj::WebSocket>>>,void>
            (&local_38,&local_48);
  Promise(this,false,&local_38);
  Own<kj::_::PromiseNode>::~Own(&local_38);
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::WebSocket>,_kj::Own<kj::WebSocket>_>_>_>
  ::~Own(&local_48);
  _::Tuple<kj::Own<kj::WebSocket>,_kj::Own<kj::WebSocket>_>::~Tuple(&local_68);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}